

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

_Bool get_commasep_word(ptrlen *list,ptrlen *word)

{
  void *__s;
  char *pcVar1;
  void *pvVar2;
  ulong uVar3;
  size_t sVar4;
  size_t __n;
  
  __n = list->len;
  if (__n != 0) {
    pcVar1 = (char *)list->ptr;
    do {
      if (*pcVar1 != ',') goto LAB_0011b08b;
      list->ptr = pcVar1 + 1;
      __n = __n - 1;
      list->len = __n;
      pcVar1 = pcVar1 + 1;
    } while (__n != 0);
    __n = 0;
  }
LAB_0011b08b:
  if (__n != 0) {
    __s = list->ptr;
    pvVar2 = memchr(__s,0x2c,__n);
    if (pvVar2 == (void *)0x0) {
      sVar4 = list->len;
      word->ptr = list->ptr;
      word->len = sVar4;
      sVar4 = 0;
    }
    else {
      uVar3 = (long)pvVar2 - (long)__s;
      word->ptr = __s;
      word->len = uVar3;
      list->ptr = (void *)((long)list->ptr + uVar3 + 1);
      sVar4 = ~uVar3 + list->len;
    }
    list->len = sVar4;
  }
  return __n != 0;
}

Assistant:

bool get_commasep_word(ptrlen *list, ptrlen *word)
{
    const char *comma;

    /*
     * Discard empty list elements, should there be any, because we
     * never want to return one as if it was a real string. (This
     * introduces a mild tolerance of badly formatted data in lists we
     * receive, but I think that's acceptable.)
     */
    while (list->len > 0 && *(const char *)list->ptr == ',') {
        list->ptr = (const char *)list->ptr + 1;
        list->len--;
    }

    if (!list->len)
        return false;

    comma = memchr(list->ptr, ',', list->len);
    if (!comma) {
        *word = *list;
        list->len = 0;
    } else {
        size_t wordlen = comma - (const char *)list->ptr;
        word->ptr = list->ptr;
        word->len = wordlen;
        list->ptr = (const char *)list->ptr + wordlen + 1;
        list->len -= wordlen + 1;
    }
    return true;
}